

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::TimeZone::NextTransition(TimeZone *this,Time t,CivilTransition *trans)

{
  undefined1 auVar1 [12];
  bool bVar2;
  CivilTransition *trans_local;
  TimeZone *this_local;
  Time t_local;
  
  auVar1._4_8_ = 0;
  auVar1._0_4_ = t.rep_.rep_hi_.lo_;
  bVar2 = anon_unknown_8::FindTransition
                    ((time_zone *)this,0x3ebfe0,(Time)(auVar1 << 0x40),
                     (CivilTransition *)(ulong)t.rep_.rep_lo_);
  return bVar2;
}

Assistant:

bool TimeZone::NextTransition(Time t, CivilTransition* trans) const {
  return FindTransition(cz_, &cctz::time_zone::next_transition, t, trans);
}